

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GridDataType2::GridDataType2
          (GridDataType2 *this,KUINT16 SampleType,vector<float,_std::allocator<float>_> *Values)

{
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType2_00218cd8;
  *(short *)&(this->super_GridData).field_0xc =
       (short)((uint)(*(int *)&(Values->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                     *(int *)&(Values->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_vf32Values,Values);
  this->m_ui16Padding = 0;
  (this->super_GridData).m_ui16SmpTyp = SampleType;
  (this->super_GridData).m_ui16DtRep = 2;
  return;
}

Assistant:

GridDataType2::GridDataType2( KUINT16 SampleType, const std::vector<KFLOAT32> & Values ) :
    m_ui16NumValues( Values.size() ),
    m_vf32Values( Values ),
    m_ui16Padding( 0 )
{
    m_ui16SmpTyp = SampleType;
    m_ui16DtRep = Type2;
}